

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
               (void)

{
  allocator<std::pair<unsigned_int,_unsigned_int>_> *this;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_00;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_01;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_02;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_03;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_04;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_05;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_06;
  undefined8 uVar1;
  bool bVar2;
  pointer __args;
  pointer pPVar3;
  pointer pPVar4;
  reference pPVar5;
  int *__args_00;
  uint *__args_1;
  uint *__args_2;
  type_conflict1 *__args_1_00;
  type_conflict1 *__args_2_00;
  type_conflict *__args_01;
  lazy_ostream *plVar6;
  reference ptVar7;
  __tuple_element_t<0UL,_tuple<int,_int,_int>_> *p_Var8;
  __tuple_element_t<1UL,_tuple<int,_int,_int>_> *p_Var9;
  __tuple_element_t<2UL,_tuple<int,_int,_int>_> *p_Var10;
  pair<std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>,_bool> pVar11;
  basic_cstring<const_char> local_12f0;
  basic_cstring<const_char> local_12e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_12d0;
  assertion_result local_12b0;
  basic_cstring<const_char> local_1298;
  basic_cstring<const_char> local_1288;
  basic_cstring<const_char> local_1278;
  basic_cstring<const_char> local_1268;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1258;
  assertion_result local_1238;
  basic_cstring<const_char> local_1220;
  basic_cstring<const_char> local_1210;
  basic_cstring<const_char> local_1200;
  basic_cstring<const_char> local_11f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_11e0;
  _Self local_11c0;
  assertion_result local_11b8;
  basic_cstring<const_char> local_11a0;
  basic_cstring<const_char> local_1190;
  undefined4 local_117c;
  basic_cstring<const_char> local_1178;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1168;
  basic_cstring<const_char> local_1140;
  basic_cstring<const_char> local_1130;
  undefined4 local_111c;
  basic_cstring<const_char> local_1118;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1108;
  basic_cstring<const_char> local_10e0;
  basic_cstring<const_char> local_10d0;
  undefined4 local_10bc;
  basic_cstring<const_char> local_10b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_10a8;
  basic_cstring<const_char> local_1080;
  basic_cstring<const_char> local_1070;
  undefined4 local_105c;
  basic_cstring<const_char> local_1058;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1048;
  basic_cstring<const_char> local_1020;
  basic_cstring<const_char> local_1010;
  undefined4 local_ffc;
  basic_cstring<const_char> local_ff8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_fe8;
  basic_cstring<const_char> local_fc0;
  basic_cstring<const_char> local_fb0;
  undefined4 local_f9c;
  basic_cstring<const_char> local_f98;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_f88;
  basic_cstring<const_char> local_f60;
  basic_cstring<const_char> local_f50;
  undefined4 local_f3c;
  basic_cstring<const_char> local_f38;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_f28;
  basic_cstring<const_char> local_f00;
  basic_cstring<const_char> local_ef0;
  undefined4 local_edc;
  basic_cstring<const_char> local_ed8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_ec8;
  basic_cstring<const_char> local_ea0;
  basic_cstring<const_char> local_e90;
  undefined4 local_e7c;
  basic_cstring<const_char> local_e78;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_e68;
  basic_cstring<const_char> local_e40;
  basic_cstring<const_char> local_e30;
  undefined4 local_e1c;
  basic_cstring<const_char> local_e18;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_e08;
  basic_cstring<const_char> local_de0;
  basic_cstring<const_char> local_dd0;
  undefined4 local_dbc;
  basic_cstring<const_char> local_db8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_da8;
  basic_cstring<const_char> local_d80;
  basic_cstring<const_char> local_d70;
  undefined4 local_d5c;
  basic_cstring<const_char> local_d58;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_d48;
  basic_cstring<const_char> local_d20;
  basic_cstring<const_char> local_d10;
  undefined4 local_cfc;
  basic_cstring<const_char> local_cf8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_ce8;
  basic_cstring<const_char> local_cc0;
  basic_cstring<const_char> local_cb0;
  undefined4 local_c9c;
  basic_cstring<const_char> local_c98;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_c88;
  basic_cstring<const_char> local_c60;
  basic_cstring<const_char> local_c50;
  undefined4 local_c3c;
  basic_cstring<const_char> local_c38;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_c28;
  basic_cstring<const_char> local_c00;
  basic_cstring<const_char> local_bf0;
  undefined4 local_bdc;
  basic_cstring<const_char> local_bd8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_bc8;
  basic_cstring<const_char> local_ba0;
  basic_cstring<const_char> local_b90;
  undefined4 local_b7c;
  basic_cstring<const_char> local_b78;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_b68;
  basic_cstring<const_char> local_b40;
  basic_cstring<const_char> local_b30;
  undefined4 local_b1c;
  basic_cstring<const_char> local_b18;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_b08;
  basic_cstring<const_char> local_ae0;
  basic_cstring<const_char> local_ad0;
  undefined4 local_abc;
  basic_cstring<const_char> local_ab8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_aa8;
  basic_cstring<const_char> local_a80;
  basic_cstring<const_char> local_a70;
  undefined4 local_a5c;
  basic_cstring<const_char> local_a58;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_a48;
  basic_cstring<const_char> local_a20;
  basic_cstring<const_char> local_a10;
  undefined4 local_9fc;
  basic_cstring<const_char> local_9f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_9e8;
  basic_cstring<const_char> local_9c0;
  basic_cstring<const_char> local_9b0;
  undefined4 local_99c;
  basic_cstring<const_char> local_998;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_988;
  basic_cstring<const_char> local_960;
  basic_cstring<const_char> local_950;
  undefined4 local_93c;
  basic_cstring<const_char> local_938;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_928;
  basic_cstring<const_char> local_900;
  basic_cstring<const_char> local_8f0;
  undefined4 local_8dc;
  basic_cstring<const_char> local_8d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_8c8;
  basic_cstring<const_char> local_8a0;
  basic_cstring<const_char> local_890;
  undefined4 local_87c;
  basic_cstring<const_char> local_878;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_868;
  basic_cstring<const_char> local_840;
  basic_cstring<const_char> local_830;
  undefined4 local_81c;
  basic_cstring<const_char> local_818;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_808;
  basic_cstring<const_char> local_7e0;
  basic_cstring<const_char> local_7d0;
  undefined4 local_7bc;
  basic_cstring<const_char> local_7b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_7a8;
  basic_cstring<const_char> local_780;
  basic_cstring<const_char> local_770;
  _Rb_tree_const_iterator<std::tuple<int,_int,_int>_> local_760;
  iterator it;
  type *z;
  type *y;
  type *x;
  uint local_728;
  _Base_ptr local_720;
  undefined1 local_718;
  _Base_ptr local_710;
  undefined1 local_708;
  __normal_iterator<const_Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_*,_std::vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>
  local_700;
  __normal_iterator<const_Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_*,_std::vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>
  local_6f8;
  const_iterator it_1;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars3;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars2;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars1;
  int local_658 [6];
  pair<unsigned_int,_unsigned_int> local_640;
  pair<unsigned_int,_unsigned_int> local_638;
  pair<unsigned_int,_unsigned_int> local_630;
  iterator local_628;
  size_type local_620;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_618;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_5f9;
  int local_5f8 [6];
  pair<unsigned_int,_unsigned_int> local_5e0;
  pair<unsigned_int,_unsigned_int> local_5d8;
  pair<unsigned_int,_unsigned_int> local_5d0;
  iterator local_5c8;
  size_type local_5c0;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_5b8;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_599;
  int local_598 [4];
  pair<unsigned_int,_unsigned_int> local_588;
  pair<unsigned_int,_unsigned_int> local_580;
  iterator local_578;
  size_type local_570;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_568;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_549;
  int local_548 [4];
  pair<unsigned_int,_unsigned_int> local_538;
  pair<unsigned_int,_unsigned_int> local_530;
  iterator local_528;
  size_type local_520;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_518;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_4f9;
  int local_4f8 [4];
  pair<unsigned_int,_unsigned_int> local_4e8;
  pair<unsigned_int,_unsigned_int> local_4e0;
  iterator local_4d8;
  size_type local_4d0;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_4c8;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_4a9;
  int local_4a8 [4];
  pair<unsigned_int,_unsigned_int> local_498;
  pair<unsigned_int,_unsigned_int> local_490;
  iterator local_488;
  size_type local_480;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_478;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_459;
  int local_458 [4];
  pair<unsigned_int,_unsigned_int> local_448;
  pair<unsigned_int,_unsigned_int> local_440;
  iterator local_438;
  size_type local_430;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_428;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_409;
  int local_408 [4];
  pair<unsigned_int,_unsigned_int> local_3f8;
  pair<unsigned_int,_unsigned_int> local_3f0;
  iterator local_3e8;
  size_type local_3e0;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_3d8;
  undefined1 local_3c0 [8];
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  reducedMatrix;
  Barcode *barcode;
  int local_398 [4];
  pair<unsigned_int,_unsigned_int> local_388;
  pair<unsigned_int,_unsigned_int> local_380;
  pair<unsigned_int,_unsigned_int> local_378;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_370;
  int local_360 [6];
  pair<unsigned_int,_unsigned_int> local_348;
  pair<unsigned_int,_unsigned_int> local_340;
  pair<unsigned_int,_unsigned_int> local_338;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_330;
  int local_320 [4];
  pair<unsigned_int,_unsigned_int> local_310;
  pair<unsigned_int,_unsigned_int> local_308;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_300;
  int local_2f0 [4];
  pair<unsigned_int,_unsigned_int> local_2e0;
  pair<unsigned_int,_unsigned_int> local_2d8;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_2d0;
  int local_2c0 [4];
  pair<unsigned_int,_unsigned_int> local_2b0;
  pair<unsigned_int,_unsigned_int> local_2a8;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_2a0;
  int local_290 [4];
  pair<unsigned_int,_unsigned_int> local_280;
  pair<unsigned_int,_unsigned_int> local_278;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_270;
  int local_260 [4];
  pair<unsigned_int,_unsigned_int> local_250;
  pair<unsigned_int,_unsigned_int> local_248;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_240;
  int local_230 [4];
  pair<unsigned_int,_unsigned_int> local_220;
  pair<unsigned_int,_unsigned_int> local_218;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_210;
  int local_200 [4];
  pair<unsigned_int,_unsigned_int> local_1f0;
  pair<unsigned_int,_unsigned_int> local_1e8;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_1e0;
  int local_1d0 [4];
  pair<unsigned_int,_unsigned_int> local_1c0;
  pair<unsigned_int,_unsigned_int> local_1b8;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_1b0;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_1a0;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_190;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_180;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_170;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_160;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_150 [2];
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_130;
  undefined1 local_120 [8];
  Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_> m
  ;
  
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>::
  Matrix((Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
          *)local_120,0x11,2);
  std::initializer_list<std::pair<unsigned_int,_unsigned_int>_>::initializer_list(&local_130);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>
              *)local_120,0,&local_130,0);
  std::initializer_list<std::pair<unsigned_int,_unsigned_int>_>::initializer_list(local_150);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>
              *)local_120,1,local_150,0);
  std::initializer_list<std::pair<unsigned_int,_unsigned_int>_>::initializer_list(&local_160);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>
              *)local_120,2,&local_160,0);
  std::initializer_list<std::pair<unsigned_int,_unsigned_int>_>::initializer_list(&local_170);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>
              *)local_120,3,&local_170,0);
  std::initializer_list<std::pair<unsigned_int,_unsigned_int>_>::initializer_list(&local_180);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>
              *)local_120,4,&local_180,0);
  std::initializer_list<std::pair<unsigned_int,_unsigned_int>_>::initializer_list(&local_190);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>
              *)local_120,5,&local_190,0);
  std::initializer_list<std::pair<unsigned_int,_unsigned_int>_>::initializer_list(&local_1a0);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>
              *)local_120,6,&local_1a0,0);
  local_1d0[3] = 0;
  local_1d0[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_1c0,local_1d0 + 3,local_1d0 + 2);
  local_1d0[1] = 1;
  local_1d0[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_1b8,local_1d0 + 1,local_1d0);
  local_1b0._M_array = &local_1c0;
  local_1b0._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>
              *)local_120,10,&local_1b0,1);
  local_200[3] = 1;
  local_200[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_1f0,local_200 + 3,local_200 + 2);
  local_200[1] = 3;
  local_200[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_1e8,local_200 + 1,local_200);
  local_1e0._M_array = &local_1f0;
  local_1e0._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>
              *)local_120,0xb,&local_1e0,1);
  local_230[3] = 2;
  local_230[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_220,local_230 + 3,local_230 + 2);
  local_230[1] = 3;
  local_230[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_218,local_230 + 1,local_230);
  local_210._M_array = &local_220;
  local_210._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>
              *)local_120,0xc,&local_210,1);
  local_260[3] = 2;
  local_260[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_250,local_260 + 3,local_260 + 2);
  local_260[1] = 4;
  local_260[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_248,local_260 + 1,local_260);
  local_240._M_array = &local_250;
  local_240._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>
              *)local_120,0xd,&local_240,1);
  local_290[3] = 3;
  local_290[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_280,local_290 + 3,local_290 + 2);
  local_290[1] = 4;
  local_290[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_278,local_290 + 1,local_290);
  local_270._M_array = &local_280;
  local_270._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>
              *)local_120,0xe,&local_270,1);
  local_2c0[3] = 2;
  local_2c0[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_2b0,local_2c0 + 3,local_2c0 + 2);
  local_2c0[1] = 6;
  local_2c0[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_2a8,local_2c0 + 1,local_2c0);
  local_2a0._M_array = &local_2b0;
  local_2a0._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>
              *)local_120,0xf,&local_2a0,1);
  local_2f0[3] = 4;
  local_2f0[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_2e0,local_2f0 + 3,local_2f0 + 2);
  local_2f0[1] = 6;
  local_2f0[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_2d8,local_2f0 + 1,local_2f0);
  local_2d0._M_array = &local_2e0;
  local_2d0._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>
              *)local_120,0x10,&local_2d0,1);
  local_320[3] = 5;
  local_320[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_310,local_320 + 3,local_320 + 2);
  local_320[1] = 6;
  local_320[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_308,local_320 + 1,local_320);
  local_300._M_array = &local_310;
  local_300._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>
              *)local_120,0x11,&local_300,1);
  local_360[5] = 0xc;
  local_360[4] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_348,local_360 + 5,local_360 + 4);
  local_360[3] = 0xd;
  local_360[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_340,local_360 + 3,local_360 + 2);
  local_360[1] = 0xe;
  local_360[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_338,local_360 + 1,local_360);
  local_330._M_array = &local_348;
  local_330._M_len = 3;
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>
              *)local_120,0x1e,&local_330,2);
  local_398[3] = 0xd;
  local_398[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_388,local_398 + 3,local_398 + 2);
  local_398[1] = 0xf;
  local_398[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_380,local_398 + 1,local_398);
  barcode._4_4_ = 0x10;
  barcode._0_4_ = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_378,(int *)((long)&barcode + 4),(int *)&barcode);
  local_370._M_array = &local_388;
  local_370._M_len = 3;
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::
  insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>
              *)local_120,0x1f,&local_370,2);
  reducedMatrix.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)Gudhi::persistence_matrix::
                Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
                ::get_current_barcode
                          ((Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
                            *)local_120);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
            *)local_3c0);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::emplace_back<>((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                    *)local_3c0);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::emplace_back<>((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                    *)local_3c0);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::emplace_back<>((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                    *)local_3c0);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::emplace_back<>((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                    *)local_3c0);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::emplace_back<>((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                    *)local_3c0);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::emplace_back<>((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                    *)local_3c0);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::emplace_back<>((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                    *)local_3c0);
  local_408[3] = 0;
  local_408[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_3f8,local_408 + 3,local_408 + 2);
  local_408[1] = 1;
  local_408[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_3f0,local_408 + 1,local_408);
  local_3e8 = &local_3f8;
  local_3e0 = 2;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_409);
  __l_06._M_len = local_3e0;
  __l_06._M_array = local_3e8;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_3d8,__l_06,&local_409);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               *)local_3c0,&local_3d8);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_3d8);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_409);
  local_458[3] = 1;
  local_458[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_448,local_458 + 3,local_458 + 2);
  local_458[1] = 3;
  local_458[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_440,local_458 + 1,local_458);
  local_438 = &local_448;
  local_430 = 2;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_459);
  __l_05._M_len = local_430;
  __l_05._M_array = local_438;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_428,__l_05,&local_459);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               *)local_3c0,&local_428);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_428);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_459);
  local_4a8[3] = 1;
  local_4a8[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_498,local_4a8 + 3,local_4a8 + 2);
  local_4a8[1] = 2;
  local_4a8[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_490,local_4a8 + 1,local_4a8);
  local_488 = &local_498;
  local_480 = 2;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_4a9);
  __l_04._M_len = local_480;
  __l_04._M_array = local_488;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_478,__l_04,&local_4a9);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               *)local_3c0,&local_478);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_478);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_4a9);
  local_4f8[3] = 2;
  local_4f8[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_4e8,local_4f8 + 3,local_4f8 + 2);
  local_4f8[1] = 4;
  local_4f8[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_4e0,local_4f8 + 1,local_4f8);
  local_4d8 = &local_4e8;
  local_4d0 = 2;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_4f9);
  __l_03._M_len = local_4d0;
  __l_03._M_array = local_4d8;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_4c8,__l_03,&local_4f9);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               *)local_3c0,&local_4c8);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_4c8);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_4f9);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::emplace_back<>((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                    *)local_3c0);
  local_548[3] = 2;
  local_548[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_538,local_548 + 3,local_548 + 2);
  local_548[1] = 6;
  local_548[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_530,local_548 + 1,local_548);
  local_528 = &local_538;
  local_520 = 2;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_549);
  __l_02._M_len = local_520;
  __l_02._M_array = local_528;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_518,__l_02,&local_549);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               *)local_3c0,&local_518);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_518);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_549);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::emplace_back<>((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                    *)local_3c0);
  local_598[3] = 2;
  local_598[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_588,local_598 + 3,local_598 + 2);
  local_598[1] = 5;
  local_598[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_580,local_598 + 1,local_598);
  local_578 = &local_588;
  local_570 = 2;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_599);
  __l_01._M_len = local_570;
  __l_01._M_array = local_578;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_568,__l_01,&local_599);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               *)local_3c0,&local_568);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_568);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_599);
  local_5f8[5] = 0xc;
  local_5f8[4] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_5e0,local_5f8 + 5,local_5f8 + 4);
  local_5f8[3] = 0xd;
  local_5f8[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_5d8,local_5f8 + 3,local_5f8 + 2);
  local_5f8[1] = 0xe;
  local_5f8[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_5d0,local_5f8 + 1,local_5f8);
  local_5c8 = &local_5e0;
  local_5c0 = 3;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_5f9);
  __l_00._M_len = local_5c0;
  __l_00._M_array = local_5c8;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_5b8,__l_00,&local_5f9);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               *)local_3c0,&local_5b8);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_5b8);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_5f9);
  local_658[5] = 0xd;
  local_658[4] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_640,local_658 + 5,local_658 + 4);
  local_658[3] = 0xf;
  local_658[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_638,local_658 + 3,local_658 + 2);
  local_658[1] = 0x10;
  local_658[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_630,local_658 + 1,local_658);
  local_628 = &local_640;
  local_620 = 3;
  this = (allocator<std::pair<unsigned_int,_unsigned_int>_> *)
         ((long)&bars1._M_t._M_impl.super__Rb_tree_header._M_node_count + 7);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(this);
  __l._M_len = local_620;
  __l._M_array = local_628;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_618,__l,this);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               *)local_3c0,&local_618);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_618);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator
            ((allocator<std::pair<unsigned_int,_unsigned_int>_> *)
             ((long)&bars1._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
            ((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_3c0,
             (Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
              *)local_120);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars3._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&it_1);
  local_6f8._M_current =
       (Persistence_interval<int,_unsigned_int> *)
       std::
       vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
       ::begin((vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                *)reducedMatrix.
                  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    local_700._M_current =
         (Persistence_interval<int,_unsigned_int> *)
         std::
         vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
         ::end((vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                *)reducedMatrix.
                  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = __gnu_cxx::operator!=(&local_6f8,&local_700);
    if (!bVar2) break;
    __args = __gnu_cxx::
             __normal_iterator<const_Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_*,_std::vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>
             ::operator->(&local_6f8);
    pPVar3 = __gnu_cxx::
             __normal_iterator<const_Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_*,_std::vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>
             ::operator->(&local_6f8);
    pPVar4 = __gnu_cxx::
             __normal_iterator<const_Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_*,_std::vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>
             ::operator->(&local_6f8);
    pVar11 = std::
             set<std::tuple<int,int,int>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
             ::emplace<int_const&,unsigned_int_const&,unsigned_int_const&>
                       ((set<std::tuple<int,int,int>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                         *)&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count,&__args->dim,
                        &pPVar3->birth,&pPVar4->death);
    local_710 = (_Base_ptr)pVar11.first._M_node;
    local_708 = pVar11.second;
    pPVar5 = __gnu_cxx::
             __normal_iterator<const_Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_*,_std::vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>
             ::operator*(&local_6f8);
    __args_00 = std::get<2ul,int,unsigned_int>(pPVar5);
    pPVar5 = __gnu_cxx::
             __normal_iterator<const_Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_*,_std::vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>
             ::operator*(&local_6f8);
    __args_1 = std::get<0ul,int,unsigned_int>(pPVar5);
    pPVar5 = __gnu_cxx::
             __normal_iterator<const_Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_*,_std::vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>
             ::operator*(&local_6f8);
    __args_2 = std::get<1ul,int,unsigned_int>(pPVar5);
    pVar11 = std::
             set<std::tuple<int,int,int>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
             ::emplace<int_const&,unsigned_int_const&,unsigned_int_const&>
                       ((set<std::tuple<int,int,int>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                         *)&bars3._M_t._M_impl.super__Rb_tree_header._M_node_count,__args_00,
                        __args_1,__args_2);
    local_720 = (_Base_ptr)pVar11.first._M_node;
    local_718 = pVar11.second;
    pPVar5 = __gnu_cxx::
             __normal_iterator<const_Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_*,_std::vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>
             ::operator*(&local_6f8);
    local_728 = pPVar5->death;
    x = *(type **)pPVar5;
    __args_1_00 = Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>::get<0ul>
                            ((Persistence_interval<int,unsigned_int> *)&x);
    __args_2_00 = Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>::get<1ul>
                            ((Persistence_interval<int,unsigned_int> *)&x);
    __args_01 = Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>::get<2ul>
                          ((Persistence_interval<int,unsigned_int> *)&x);
    pVar11 = std::
             set<std::tuple<int,int,int>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
             ::emplace<int&,unsigned_int&,unsigned_int&>
                       ((set<std::tuple<int,int,int>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                         *)&it_1,__args_01,__args_1_00,__args_2_00);
    it._M_node = (_Base_ptr)pVar11.first._M_node;
    __gnu_cxx::
    __normal_iterator<const_Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_*,_std::vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>
    ::operator++(&local_6f8);
  }
  local_760._M_node =
       (_Base_ptr)
       std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::
       begin((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_770,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_780);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_770,0x634,&local_780);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_7a8,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_7bc = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_7a8,&local_7b8,0x634,1,2,p_Var8,"std::get<0>(*it)",&local_7bc,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_7a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_7e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_7d0,0x635,&local_7e0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_808,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_818,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_81c = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_808,&local_818,0x635,1,2,p_Var9,"std::get<1>(*it)",&local_81c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_808);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_830,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_840);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_830,0x636,&local_840);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_868,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_878,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_87c = 0xffffffff;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_868,&local_878,0x636,1,2,p_Var10,"std::get<2>(*it)",&local_87c,"-1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_868);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_760);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_890,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_8a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_890,0x638,&local_8a0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_8c8,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_8dc = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_8c8,&local_8d8,0x638,1,2,p_Var8,"std::get<0>(*it)",&local_8dc,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_8c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8f0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_900);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_8f0,0x639,&local_900);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_928,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_938,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_93c = 1;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_928,&local_938,0x639,1,2,p_Var9,"std::get<1>(*it)",&local_93c,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_928);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_950,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_960);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_950,0x63a,&local_960);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_988,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_998,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_99c = 7;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_988,&local_998,0x63a,1,2,p_Var10,"std::get<2>(*it)",&local_99c,"7");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_988);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_760);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_9c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_9b0,0x63c,&local_9c0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_9e8,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_9fc = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_9e8,&local_9f8,0x63c,1,2,p_Var8,"std::get<0>(*it)",&local_9fc,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_9e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a10,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a20);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a10,0x63d,&local_a20);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_a48,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a58,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_a5c = 2;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_a48,&local_a58,0x63d,1,2,p_Var9,"std::get<1>(*it)",&local_a5c,"2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_a48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a70,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a80);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a70,0x63e,&local_a80);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_aa8,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ab8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_abc = 9;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_aa8,&local_ab8,0x63e,1,2,p_Var10,"std::get<2>(*it)",&local_abc,"9");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_aa8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_760);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ad0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_ae0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_ad0,0x640,&local_ae0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_b08,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b18,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_b1c = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_b08,&local_b18,0x640,1,2,p_Var8,"std::get<0>(*it)",&local_b1c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_b08);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b30,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b40);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_b30,0x641,&local_b40);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_b68,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b78,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_b7c = 3;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_b68,&local_b78,0x641,1,2,p_Var9,"std::get<1>(*it)",&local_b7c,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_b68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b90,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_ba0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_b90,0x642,&local_ba0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_bc8,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_bd8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_bdc = 8;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_bc8,&local_bd8,0x642,1,2,p_Var10,"std::get<2>(*it)",&local_bdc,"8");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_bc8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_760);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_bf0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c00);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_bf0,0x644,&local_c00);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_c28,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c38,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_c3c = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_c28,&local_c38,0x644,1,2,p_Var8,"std::get<0>(*it)",&local_c3c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_c28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c50,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c60);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_c50,0x645,&local_c60);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_c88,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c98,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_c9c = 4;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_c88,&local_c98,0x645,1,2,p_Var9,"std::get<1>(*it)",&local_c9c,"4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_c88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_cb0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_cc0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_cb0,0x646,&local_cc0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_ce8,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_cf8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_cfc = 10;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_ce8,&local_cf8,0x646,1,2,p_Var10,"std::get<2>(*it)",&local_cfc,"10");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_ce8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_760);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d10,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d20);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d10,0x648,&local_d20);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_d48,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d58,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_d5c = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_d48,&local_d58,0x648,1,2,p_Var8,"std::get<0>(*it)",&local_d5c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_d48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d70,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d80);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d70,0x649,&local_d80);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_da8,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_db8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_dbc = 5;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_da8,&local_db8,0x649,1,2,p_Var9,"std::get<1>(*it)",&local_dbc,"5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_da8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_dd0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_de0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_dd0,0x64a,&local_de0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_e08,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e18,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_e1c = 0xe;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_e08,&local_e18,0x64a,1,2,p_Var10,"std::get<2>(*it)",&local_e1c,"14");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_e08);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_760);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e30,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e40);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_e30,0x64c,&local_e40);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_e68,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e78,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_e7c = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_e68,&local_e78,0x64c,1,2,p_Var8,"std::get<0>(*it)",&local_e7c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_e68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e90,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_ea0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_e90,0x64d,&local_ea0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_ec8,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ed8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_edc = 6;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_ec8,&local_ed8,0x64d,1,2,p_Var9,"std::get<1>(*it)",&local_edc,"6");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_ec8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ef0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f00);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_ef0,0x64e,&local_f00);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_f28,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f38,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_f3c = 0xc;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_f28,&local_f38,0x64e,1,2,p_Var10,"std::get<2>(*it)",&local_f3c,"12");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_f28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_760);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f50,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f60);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f50,0x650,&local_f60);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_f88,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f98,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_f9c = 1;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_f88,&local_f98,0x650,1,2,p_Var8,"std::get<0>(*it)",&local_f9c,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_f88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_fb0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_fc0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_fb0,0x651,&local_fc0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_fe8,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ff8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_ffc = 0xb;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_fe8,&local_ff8,0x651,1,2,p_Var9,"std::get<1>(*it)",&local_ffc,"11");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_fe8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1010,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1020);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1010,0x652,&local_1020);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1048,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1058,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_105c = 0xf;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_1048,&local_1058,0x652,1,2,p_Var10,"std::get<2>(*it)",&local_105c,"15");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1048);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_760);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1070,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1080);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1070,0x654,&local_1080);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_10a8,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_10b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_10bc = 1;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_10a8,&local_10b8,0x654,1,2,p_Var8,"std::get<0>(*it)",&local_10bc,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_10a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_10d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_10e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_10d0,0x655,&local_10e0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1108,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1118,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_111c = 0xd;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_1108,&local_1118,0x655,1,2,p_Var9,"std::get<1>(*it)",&local_111c,"13");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1108);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1130,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1140);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1130,0x656,&local_1140);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1168,plVar6,(char (*) [1])0x271234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1178,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_760);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_117c = 0x10;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_1168,&local_1178,0x656,1,2,p_Var10,"std::get<2>(*it)",&local_117c,"16");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1168);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_760);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1190,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_11a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1190,0x658,&local_11a0);
    local_11c0._M_node =
         (_Base_ptr)
         std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::
         end((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar2 = std::operator==(&local_760,&local_11c0);
    boost::test_tools::assertion_result::assertion_result(&local_11b8,bVar2);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_11f0,"it == bars1.end()",0x11);
    boost::unit_test::operator<<(&local_11e0,plVar6,&local_11f0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1200,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_11b8,&local_11e0,&local_1200,0x658,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_11e0);
    boost::test_tools::assertion_result::~assertion_result(&local_11b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1210,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1220);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1210,0x65a,&local_1220);
    bVar2 = std::operator==((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
                             *)&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
                             *)&bars3._M_t._M_impl.super__Rb_tree_header._M_node_count);
    boost::test_tools::assertion_result::assertion_result(&local_1238,bVar2);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1268,"bars1 == bars2",0xe);
    boost::unit_test::operator<<(&local_1258,plVar6,&local_1268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1278,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_1238,&local_1258,&local_1278,0x65a,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1258);
    boost::test_tools::assertion_result::~assertion_result(&local_1238);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1288,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1298);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1288,0x65b,&local_1298);
    bVar2 = std::operator==((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
                             *)&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
                             *)&it_1);
    boost::test_tools::assertion_result::assertion_result(&local_12b0,bVar2);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_12e0,"bars1 == bars3",0xe);
    boost::unit_test::operator<<(&local_12d0,plVar6,&local_12e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_12f0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_12b0,&local_12d0,&local_12f0,0x65b,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_12d0);
    boost::test_tools::assertion_result::~assertion_result(&local_12b0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::~set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&it_1);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::~set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars3._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::~set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)local_3c0);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>::
  ~Matrix((Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
           *)local_120);
  return;
}

Assistant:

void test_shifted_barcode1() {
  using C = typename Matrix::Column;
  struct BarComp {
    bool operator()(const std::tuple<int, int, int>& c1, const std::tuple<int, int, int>& c2) const {
      if (std::get<0>(c1) != std::get<0>(c2)) return std::get<0>(c1) < std::get<0>(c2);
      if (std::get<1>(c1) != std::get<1>(c2)) return std::get<1>(c1) < std::get<1>(c2);
      return std::get<2>(c1) < std::get<2>(c2);
    }
  };

  Matrix m(17, 2);
  if constexpr (is_z2<C>()) {
    m.insert_boundary(0, {}, 0);
    m.insert_boundary(1, {}, 0);
    m.insert_boundary(2, {}, 0);
    m.insert_boundary(3, {}, 0);
    m.insert_boundary(4, {}, 0);
    m.insert_boundary(5, {}, 0);
    m.insert_boundary(6, {}, 0);
    m.insert_boundary(10, {0, 1}, 1);
    m.insert_boundary(11, {1, 3}, 1);
    m.insert_boundary(12, {2, 3}, 1);
    m.insert_boundary(13, {2, 4}, 1);
    m.insert_boundary(14, {3, 4}, 1);
    m.insert_boundary(15, {2, 6}, 1);
    m.insert_boundary(16, {4, 6}, 1);
    m.insert_boundary(17, {5, 6}, 1);
    m.insert_boundary(30, {12, 13, 14}, 2);
    m.insert_boundary(31, {13, 15, 16}, 2);
  } else {
    m.insert_boundary(0, {}, 0);
    m.insert_boundary(1, {}, 0);
    m.insert_boundary(2, {}, 0);
    m.insert_boundary(3, {}, 0);
    m.insert_boundary(4, {}, 0);
    m.insert_boundary(5, {}, 0);
    m.insert_boundary(6, {}, 0);
    m.insert_boundary(10, {{0, 1}, {1, 1}}, 1);
    m.insert_boundary(11, {{1, 1}, {3, 1}}, 1);
    m.insert_boundary(12, {{2, 1}, {3, 1}}, 1);
    m.insert_boundary(13, {{2, 1}, {4, 1}}, 1);
    m.insert_boundary(14, {{3, 1}, {4, 1}}, 1);
    m.insert_boundary(15, {{2, 1}, {6, 1}}, 1);
    m.insert_boundary(16, {{4, 1}, {6, 1}}, 1);
    m.insert_boundary(17, {{5, 1}, {6, 1}}, 1);
    m.insert_boundary(30, {{12, 1}, {13, 1}, {14, 1}}, 2);
    m.insert_boundary(31, {{13, 1}, {15, 1}, {16, 1}}, 2);
  }

  const auto& barcode = m.get_current_barcode();

  std::vector<witness_content<C> > reducedMatrix;
  if constexpr (is_z2<C>()) {
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({0, 1});
      reducedMatrix.push_back({1, 3});
      reducedMatrix.push_back({1, 2});
      reducedMatrix.push_back({2, 4});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({2, 6});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({2, 5});
      reducedMatrix.push_back({12, 13, 14});
      reducedMatrix.push_back({13, 15, 16});
    } else {
      reducedMatrix.push_back({0});
      reducedMatrix.push_back({0, 1});
      reducedMatrix.push_back({0, 2});
      reducedMatrix.push_back({0, 3});
      reducedMatrix.push_back({0, 4});
      reducedMatrix.push_back({0, 5});
      reducedMatrix.push_back({0, 6});
      reducedMatrix.push_back({10});
      reducedMatrix.push_back({10, 11});
      reducedMatrix.push_back({10, 11, 12});
      reducedMatrix.push_back({10, 11, 12, 13});
      reducedMatrix.push_back({12, 13, 14});
      reducedMatrix.push_back({10, 11, 12, 15});
      reducedMatrix.push_back({13, 15, 16});
      reducedMatrix.push_back({10, 11, 12, 15, 17});
      reducedMatrix.push_back({30});
      reducedMatrix.push_back({31});
    }
  } else {
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({{0, 1}, {1, 1}});
      reducedMatrix.push_back({{1, 1}, {3, 1}});
      reducedMatrix.push_back({{1, 1}, {2, 1}});
      reducedMatrix.push_back({{2, 1}, {4, 1}});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({{2, 1}, {6, 1}});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({{2, 1}, {5, 1}});
      reducedMatrix.push_back({{12, 1}, {13, 1}, {14, 1}});
      reducedMatrix.push_back({{13, 1}, {15, 1}, {16, 1}});
    } else {
      reducedMatrix.push_back({{0, 1}});
      reducedMatrix.push_back({{0, 1}, {1, 1}});
      reducedMatrix.push_back({{0, 1}, {2, 1}});
      reducedMatrix.push_back({{0, 1}, {3, 1}});
      reducedMatrix.push_back({{0, 1}, {4, 1}});
      reducedMatrix.push_back({{0, 1}, {5, 1}});
      reducedMatrix.push_back({{0, 1}, {6, 1}});
      reducedMatrix.push_back({{10, 1}});
      reducedMatrix.push_back({{10, 1}, {11, 1}});
      reducedMatrix.push_back({{10, 1}, {11, 1}, {12, 1}});
      reducedMatrix.push_back({{10, 1}, {11, 1}, {12, 1}, {13, 1}});
      reducedMatrix.push_back({{12, 1}, {13, 1}, {14, 1}});
      reducedMatrix.push_back({{10, 1}, {11, 1}, {12, 1}, {15, 1}});
      reducedMatrix.push_back({{13, 1}, {15, 1}, {16, 1}});
      reducedMatrix.push_back({{10, 1}, {11, 1}, {12, 1}, {15, 1}, {17, 1}});
      reducedMatrix.push_back({{30, 1}});
      reducedMatrix.push_back({{31, 1}});
    }
  }

  if constexpr (Matrix::Option_list::column_indexation_type == Column_indexation_types::IDENTIFIER) {
    test_column_equality<C>(reducedMatrix[0], get_column_content_via_iterators(m.get_column(0)));
    test_column_equality<C>(reducedMatrix[1], get_column_content_via_iterators(m.get_column(1)));
    test_column_equality<C>(reducedMatrix[2], get_column_content_via_iterators(m.get_column(2)));
    test_column_equality<C>(reducedMatrix[3], get_column_content_via_iterators(m.get_column(3)));
    test_column_equality<C>(reducedMatrix[4], get_column_content_via_iterators(m.get_column(4)));
    test_column_equality<C>(reducedMatrix[5], get_column_content_via_iterators(m.get_column(5)));
    test_column_equality<C>(reducedMatrix[6], get_column_content_via_iterators(m.get_column(6)));
    test_column_equality<C>(reducedMatrix[7], get_column_content_via_iterators(m.get_column(10)));
    test_column_equality<C>(reducedMatrix[8], get_column_content_via_iterators(m.get_column(11)));
    test_column_equality<C>(reducedMatrix[9], get_column_content_via_iterators(m.get_column(12)));
    test_column_equality<C>(reducedMatrix[10], get_column_content_via_iterators(m.get_column(13)));
    test_column_equality<C>(reducedMatrix[11], get_column_content_via_iterators(m.get_column(14)));
    test_column_equality<C>(reducedMatrix[12], get_column_content_via_iterators(m.get_column(15)));
    test_column_equality<C>(reducedMatrix[13], get_column_content_via_iterators(m.get_column(16)));
    test_column_equality<C>(reducedMatrix[14], get_column_content_via_iterators(m.get_column(17)));
    test_column_equality<C>(reducedMatrix[15], get_column_content_via_iterators(m.get_column(30)));
    test_column_equality<C>(reducedMatrix[16], get_column_content_via_iterators(m.get_column(31)));
  } else {
    test_content_equality(reducedMatrix, m);
  }

  std::set<std::tuple<int, int, int>, BarComp> bars1;
  std::set<std::tuple<int, int, int>, BarComp> bars2;
  std::set<std::tuple<int, int, int>, BarComp> bars3;
  // bars are not ordered the same for all matrices
  for (auto it = barcode.begin(); it != barcode.end(); ++it) {
    // three access possibilities
    bars1.emplace(it->dim, it->birth, it->death);
    bars2.emplace(std::get<2>(*it), std::get<0>(*it), std::get<1>(*it));
    auto [x, y, z] = *it;
    bars3.emplace(z, x, y);
  }
  auto it = bars1.begin();
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<2>(*it), -1);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 7);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 2);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 9);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 3);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 8);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 4);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 10);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 5);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 14);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 6);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 12);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 11);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 15);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 13);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 16);
  ++it;
  BOOST_CHECK(it == bars1.end());

  BOOST_CHECK(bars1 == bars2);
  BOOST_CHECK(bars1 == bars3);
}